

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

int __thiscall Bstrlib::CBString::find(CBString *this,char *b,int pos)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  CBStringException *this_00;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uchar uVar11;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  uVar6 = (ulong)(uint)pos;
  if (b == (char *)0x0) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"CBString::CBString::find NULL.","");
    CBStringException::CBStringException(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&local_38);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  uVar2 = (this->super_tagbstring).slen;
  iVar3 = -1;
  iVar9 = iVar3;
  if ((((uint)pos <= uVar2) && (uVar1 = *b, iVar9 = pos, uVar1 != '\0')) &&
     (iVar9 = iVar3, uVar2 != pos)) {
    if (b[1] != '\0') {
      puVar7 = (this->super_tagbstring).data;
      uVar8 = 0xffffffff;
      do {
        lVar10 = 0;
        uVar11 = uVar1;
        do {
          uVar5 = (uint)((long)(int)uVar2 + -1);
          iVar9 = (int)lVar10;
          if ((int)uVar5 <= (int)uVar6) {
LAB_001562da:
            uVar4 = (uint)uVar6;
            if (uVar4 != uVar5) {
              return -1;
            }
            if (uVar11 != puVar7[(int)uVar4]) {
              return -1;
            }
            if (b[(long)iVar9 + 1] != '\0') {
              return -1;
            }
            break;
          }
          uVar6 = (ulong)(int)uVar6;
          while (uVar11 != puVar7[uVar6]) {
            if (uVar11 == puVar7[uVar6 + 1]) {
              uVar6 = (ulong)((int)uVar6 + 1);
              break;
            }
            uVar6 = uVar6 + 2;
            if ((long)(int)uVar2 + -1 <= (long)uVar6) goto LAB_001562da;
          }
          if (iVar9 == 0) {
            uVar8 = uVar6 & 0xffffffff;
          }
          uVar4 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar4;
          uVar11 = b[(long)iVar9 + 1];
          lVar10 = (long)iVar9 + 1;
          iVar9 = (int)lVar10;
        } while (uVar11 != '\0');
        if (uVar4 == (int)uVar8 + iVar9) {
          return (int)uVar8;
        }
        uVar6 = (ulong)(uVar4 - iVar9);
      } while( true );
    }
    if (pos < (int)uVar2 && -1 < pos) {
      puVar7 = (this->super_tagbstring).data + (uint)pos;
      do {
        if (*puVar7 == uVar1) {
          return (int)uVar6;
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        puVar7 = puVar7 + 1;
      } while ((int)uVar5 < (int)uVar2);
    }
  }
  return iVar9;
}

Assistant:

int CBString::find (const char * b, int pos) const {
int ii, j;
unsigned char c0;
int i, l;
unsigned char cx;
unsigned char * pdata;

	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::find NULL.");
#else
		return BSTR_ERR;
#endif
	}

	if ((unsigned int) pos > (unsigned int) slen) return BSTR_ERR;
	if ('\0' == b[0]) return pos;
	if (pos == slen) return BSTR_ERR;
	if ('\0' == b[1]) return find (b[0], pos);

	cx = c0 = (unsigned char) b[0];
	l = slen - 1;

	pdata = data;
	for (ii = -1, i = pos, j = 0; i < l;) {
		/* Unrolled current character test */
		if (cx != pdata[i]) {
			if (cx != pdata[1+i]) {
				i += 2;
				continue;
			}
			i++;
		}

		/* Take note if this is the start of a potential match */
		if (0 == j) ii = i;

		/* Shift the test character down by one */
		j++;
		i++;

		/* If this isn't past the last character continue */
		if ('\0' != (cx = b[j])) continue;

		N0:;

		/* If no characters mismatched, then we matched */
		if (i == ii+j) return ii;

		/* Shift back to the beginning */
		i -= j;
		j = 0;
		cx = c0;
	}

	/* Deal with last case if unrolling caused a misalignment */
	if (i == l && cx == pdata[i] && '\0' == b[j+1]) goto N0;

	return BSTR_ERR;
}